

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

size_t __thiscall
pstore::file::file_handle::read_buffer(file_handle *this,not_null<void_*> buffer,size_t nbytes)

{
  size_t sVar1;
  int *piVar2;
  int err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((long)nbytes < 0) {
    raise<std::errc,char[12]>(invalid_argument,(char (*) [12])"read_buffer");
  }
  ensure_open(this);
  sVar1 = read(this->file_,buffer.ptr_,nbytes);
  if (-1 < (long)sVar1) {
    return sVar1;
  }
  if (sVar1 == 0xffffffffffffffff) {
    piVar2 = __errno_location();
    err = *piVar2;
  }
  else {
    err = 0x16;
  }
  std::__cxx11::string::string((string *)&local_40,(string *)&this->path_);
  (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
            (err,"read failed",&local_40);
}

Assistant:

std::size_t file_handle::read_buffer (gsl::not_null<void *> const buffer,
                                              std::size_t const nbytes) {
            if (nbytes > unsigned_cast (std::numeric_limits<ssize_t>::max ())) {
                raise (std::errc::invalid_argument, "read_buffer");
            }
            this->ensure_open ();

            ssize_t const r = ::read (file_, buffer.get (), nbytes);
            if (r < 0) {
                int const err = (r == -1) ? errno : EINVAL;
                raise_file_error (err, "read failed", this->path ());
            }
            return static_cast<std::size_t> (r);
        }